

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBRowDownEvenBox_C
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  long lVar1;
  byte *pbVar2;
  
  lVar1 = 0;
  if (dst_width < 1) {
    dst_width = 0;
  }
  pbVar2 = src_argb + 7;
  for (; dst_width != (int)lVar1; lVar1 = lVar1 + 1) {
    dst_argb[lVar1 * 4] =
         (uint8_t)((uint)pbVar2[src_stride + -7] + (uint)pbVar2[-3] + (uint)pbVar2[-7] +
                   (uint)pbVar2[src_stride + -3] + 2 >> 2);
    dst_argb[lVar1 * 4 + 1] =
         (uint8_t)((uint)pbVar2[src_stride + -6] + (uint)pbVar2[-2] + (uint)pbVar2[-6] +
                   (uint)pbVar2[src_stride + -2] + 2 >> 2);
    dst_argb[lVar1 * 4 + 2] =
         (uint8_t)((uint)pbVar2[src_stride + -5] + (uint)pbVar2[-1] + (uint)pbVar2[-5] +
                   (uint)pbVar2[src_stride + -1] + 2 >> 2);
    dst_argb[lVar1 * 4 + 3] =
         (uint8_t)((uint)pbVar2[src_stride + -4] + (uint)*pbVar2 + (uint)pbVar2[-4] +
                   (uint)pbVar2[src_stride] + 2 >> 2);
    pbVar2 = pbVar2 + (src_stepx << 2);
  }
  return;
}

Assistant:

void ScaleARGBRowDownEvenBox_C(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               int src_stepx,
                               uint8_t* dst_argb,
                               int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_argb[0] = (src_argb[0] + src_argb[4] + src_argb[src_stride] +
                   src_argb[src_stride + 4] + 2) >>
                  2;
    dst_argb[1] = (src_argb[1] + src_argb[5] + src_argb[src_stride + 1] +
                   src_argb[src_stride + 5] + 2) >>
                  2;
    dst_argb[2] = (src_argb[2] + src_argb[6] + src_argb[src_stride + 2] +
                   src_argb[src_stride + 6] + 2) >>
                  2;
    dst_argb[3] = (src_argb[3] + src_argb[7] + src_argb[src_stride + 3] +
                   src_argb[src_stride + 7] + 2) >>
                  2;
    src_argb += src_stepx * 4;
    dst_argb += 4;
  }
}